

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
ExpressionRunnerRunAndDispose(ExpressionRunnerRef runner,BinaryenExpressionRef expr)

{
  bool bVar1;
  Module *module;
  NonconstantException *anon_var_0;
  undefined1 local_70 [8];
  Flow flow;
  Expression *ret;
  CExpressionRunner *R;
  BinaryenExpressionRef expr_local;
  ExpressionRunnerRef runner_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)0x0;
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_70,(ExpressionRunner<wasm::CExpressionRunner> *)runner,expr);
  bVar1 = wasm::Flow::breaking((Flow *)local_70);
  if (!bVar1) {
    bVar1 = wasm::SmallVector<wasm::Literal,_1UL>::empty
                      ((SmallVector<wasm::Literal,_1UL> *)local_70);
    if (!bVar1) {
      module = wasm::ExpressionRunner<wasm::CExpressionRunner>::getModule
                         ((ExpressionRunner<wasm::CExpressionRunner> *)runner);
      flow.breakTo.super_IString.str._M_str =
           (char *)wasm::Flow::getConstExpression((Flow *)local_70,module);
    }
  }
  wasm::Flow::~Flow((Flow *)local_70);
  if (runner != (ExpressionRunnerRef)0x0) {
    wasm::CExpressionRunner::~CExpressionRunner(runner);
    operator_delete(runner,0x98);
  }
  return (BinaryenExpressionRef)flow.breakTo.super_IString.str._M_str;
}

Assistant:

BinaryenExpressionRef
ExpressionRunnerRunAndDispose(ExpressionRunnerRef runner,
                              BinaryenExpressionRef expr) {
  auto* R = (CExpressionRunner*)runner;
  Expression* ret = nullptr;
  try {
    auto flow = R->visit(expr);
    if (!flow.breaking() && !flow.values.empty()) {
      ret = flow.getConstExpression(*R->getModule());
    }
  } catch (NonconstantException&) {
  }
  delete R;
  return ret;
}